

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

string * __thiscall
QStringConverterICU::nul_terminate_impl_abi_cxx11_
          (string *__return_storage_ptr__,QStringConverterICU *this,QStringView name)

{
  QLatin1 *this_00;
  char *pcVar1;
  storage_type_conflict *psVar2;
  QStringView in;
  
  psVar2 = name.m_data;
  in.m_size = name.m_size;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&__return_storage_ptr__->field_2 + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,(size_type)this,'\0');
  this_00 = (QLatin1 *)(__return_storage_ptr__->_M_dataplus)._M_p;
  in.m_data = psVar2;
  pcVar1 = QLatin1::convertFromUnicode(this_00,(char *)this,in);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,(long)pcVar1 - (long)this_00,'\0');
  return __return_storage_ptr__;
}

Assistant:

static std::string nul_terminate_impl(QStringView name)
    {
        std::string result;
        const auto convert = [&](char *p, size_t n) {
                const auto sz = QLatin1::convertFromUnicode(p, name) - p;
                Q_ASSERT(q20::cmp_less_equal(sz, n));
                return sz;
            };
#ifdef __cpp_lib_string_resize_and_overwrite
        result.resize_and_overwrite(size_t(name.size()), convert);
#else
        result.resize(size_t(name.size()));
        result.resize(convert(result.data(), result.size()));
#endif // __cpp_lib_string_resize_and_overwrite
        return result;
    }